

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::finalizeComplete(Federate *this)

{
  Modes MVar1;
  long in_RDI;
  handle asyncInfo;
  Federate *in_stack_000000d0;
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *in_stack_ffffffffffffffb8;
  Federate *this_00;
  future<void> *in_stack_ffffffffffffffd0;
  
  if ((*(byte *)(in_RDI + 0xe) & 1) == 0) {
    MVar1 = std::atomic::operator_cast_to_Modes((atomic<helics::Federate::Modes> *)0x310e76);
    if (MVar1 == PENDING_FINALIZE) {
      std::
      unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
      ::operator->((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                    *)0x310e88);
      this_00 = (Federate *)&stack0xffffffffffffffe0;
      gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
                (in_stack_ffffffffffffffb8);
      gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->
                ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)this_00);
      std::future<void>::get(in_stack_ffffffffffffffd0);
      finalizeOperations(this_00);
      gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::~lock_handle
                ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)0x310ec8);
    }
    else {
      finalize(in_stack_000000d0);
    }
  }
  else {
    finalize(in_stack_000000d0);
  }
  return;
}

Assistant:

void Federate::finalizeComplete()
{
    if (singleThreadFederate) {
        return finalize();
    }
    if (currentMode == Modes::PENDING_FINALIZE) {
        auto asyncInfo = asyncCallInfo->lock();
        asyncInfo->finalizeFuture.get();
        finalizeOperations();
    } else {
        finalize();
    }
}